

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O2

void __thiscall OpenMD::BondAngleDistribution::process(BondAngleDistribution *this)

{
  SelectionManager *this_00;
  int *piVar1;
  char cVar2;
  int iVar3;
  SimInfo *info;
  int iVar4;
  StuntDouble *this_01;
  Molecule *pMVar5;
  long lVar6;
  int iVar7;
  Atom *this_02;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int whichFrame;
  pointer ppAVar12;
  double dVar13;
  int local_134c;
  int i;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> bondvec;
  MoleculeIterator mi;
  Vector3d vec;
  Vector<double,_3U> local_12d0;
  Vector3d vec1;
  Vector3d vec2;
  DumpReader reader;
  
  mi._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&vec.super_Vector<double,_3U>);
  bondvec.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bondvec.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bondvec.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&reader,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar4 = DumpReader::getNFrames(&reader);
  this->frameCounter_ = 0;
  this->nTotBonds_ = 0;
  this_00 = &this->seleMan_;
  for (whichFrame = 0; whichFrame < iVar4;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&reader,whichFrame);
    this->frameCounter_ = this->frameCounter_ + 1;
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&vec1,&this->evaluator_);
      SelectionManager::setSelectionSet(this_00,(SelectionSet *)&vec1);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&vec1);
    }
    this_01 = SelectionManager::beginSelected(this_00,&i);
    while (this_01 != (StuntDouble *)0x0) {
      if (bondvec.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          bondvec.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        bondvec.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             bondvec.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      iVar3 = this_01->globalIndex_;
      pMVar5 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&mi);
      local_134c = 0;
      while (pMVar5 != (Molecule *)0x0) {
        ppAVar12 = (pMVar5->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppAVar12 !=
            (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_0012aabf;
        this_02 = (Atom *)0x0;
        while (this_02 != (Atom *)0x0) {
          if ((this_02->super_StuntDouble).globalIndex_ != iVar3) {
            StuntDouble::getPos((Vector3d *)&vec2.super_Vector<double,_3U>,this_01);
            StuntDouble::getPos((Vector3d *)&local_12d0,&this_02->super_StuntDouble);
            operator-((Vector<double,_3U> *)&vec1,&vec2.super_Vector<double,_3U>,&local_12d0);
            Vector3<double>::operator=(&vec,(Vector<double,_3U> *)&vec1);
            if (cVar2 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&vec);
            }
            dVar13 = Vector<double,_3U>::length(&vec.super_Vector<double,_3U>);
            if (dVar13 < this->rCut_) {
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              push_back(&bondvec,&vec);
              local_134c = local_134c + 1;
              this->nTotBonds_ = this->nTotBonds_ + 1;
            }
          }
          ppAVar12 = ppAVar12 + 1;
          this_02 = (Atom *)0x0;
          if (ppAVar12 !=
              (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_0012aabf:
            this_02 = *ppAVar12;
          }
        }
        iVar11 = 1;
        iVar7 = 1;
        if (1 < local_134c) {
          iVar7 = local_134c;
        }
        lVar6 = 0x18;
        uVar9 = 0;
        while (uVar9 != iVar7 - 1) {
          Vector<double,_3U>::Vector
                    ((Vector<double,_3U> *)&vec1,
                     &bondvec.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9].super_Vector<double,_3U>);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)&vec1);
          uVar9 = uVar9 + 1;
          lVar8 = lVar6;
          for (iVar10 = iVar11; iVar10 < local_134c; iVar10 = iVar10 + 1) {
            Vector<double,_3U>::Vector
                      (&vec2.super_Vector<double,_3U>,
                       (Vector<double,_3U> *)
                       ((long)((bondvec.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>
                              ).data_ + lVar8));
            Vector<double,_3U>::normalize(&vec2.super_Vector<double,_3U>);
            dVar13 = dot<double,3u>((Vector<double,_3U> *)&vec1,&vec2.super_Vector<double,_3U>);
            dVar13 = acos(dVar13);
            dVar13 = (dVar13 * 180.0) / 3.141592653589793;
            piVar1 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     (int)((double)(~-(ulong)(180.0 < dVar13) & (ulong)dVar13 |
                                   (ulong)(360.0 - dVar13) & -(ulong)(180.0 < dVar13)) /
                          this->deltaTheta_);
            *piVar1 = *piVar1 + 2;
            lVar8 = lVar8 + 0x18;
          }
          lVar6 = lVar6 + 0x18;
          iVar11 = iVar11 + 1;
        }
        pMVar5 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&mi);
      }
      this_01 = SelectionManager::nextSelected(this_00,&i);
    }
  }
  writeBondAngleDistribution(this);
  DumpReader::~DumpReader(&reader);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&bondvec.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  return;
}

Assistant:

void BondAngleDistribution::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    std::vector<Vector3d> bondvec;
    RealType r;
    int nBonds;
    int i;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    nTotBonds_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;
        bondvec.clear();

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and make a pair list

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                // Add neighbor to bond list's
                bondvec.push_back(vec);
                nBonds++;
                nTotBonds_++;
              }
            }
          }

          for (int i = 0; i < nBonds - 1; i++) {
            Vector3d vec1 = bondvec[i];
            vec1.normalize();
            for (int j = i + 1; j < nBonds; j++) {
              Vector3d vec2 = bondvec[j];

              vec2.normalize();

              RealType theta = acos(dot(vec1, vec2)) * 180.0 / Constants::PI;

              if (theta > 180.0) { theta = 360.0 - theta; }
              int whichBin = int(theta / deltaTheta_);

              histogram_[whichBin] += 2;
            }
          }
        }
      }
    }

    writeBondAngleDistribution();
  }